

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst07.c
# Opt level: O2

int cgst07(trans_t trans,int n,int nrhs,SuperMatrix *A,singlecomplex *b,int ldb,singlecomplex *x,
          int ldx,singlecomplex *xact,int ldxact,float *ferr,float *berr,float *reslts)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  integer iVar7;
  float *addr;
  ulong uVar8;
  singlecomplex *psVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int c__1;
  long local_170;
  ulong local_168;
  singlecomplex *local_160;
  long local_158;
  long local_150;
  long local_148;
  ulong local_140;
  int n__1;
  
  uVar6 = (ulong)(uint)n;
  c__1 = 1;
  if (n < 1 || nrhs < 1) {
    reslts[0] = 0.0;
    reslts[1] = 0.0;
  }
  else {
    local_160 = b;
    fVar13 = smach("Epsilon");
    fVar14 = smach("Safe minimum");
    addr = (float *)superlu_malloc(uVar6 * 4);
    if (addr == (float *)0x0) {
      sprintf((char *)&n__1,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for rwork",0x71,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/TESTING/cgst07.c"
             );
      superlu_abort_and_exit((char *)&n__1);
    }
    pvVar4 = A->Store;
    lVar5 = *(long *)((long)pvVar4 + 8);
    local_170 = (long)ldx;
    local_168 = (ulong)(uint)nrhs;
    local_150 = (long)ldxact << 3;
    local_158 = local_170 * 8;
    fVar16 = 0.0;
    uVar8 = 0;
    psVar9 = x;
    while (uVar8 != local_168) {
      local_148 = uVar8 * local_170;
      local_140 = uVar8;
      n__1 = n;
      iVar7 = icamax_(&n__1,x + local_148,&c__1);
      fVar17 = ABS(x[(int)local_148 + -1 + iVar7].i) + ABS(x[(int)local_148 + -1 + iVar7].r);
      fVar15 = 0.0;
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        fVar18 = ABS(psVar9[uVar8].i - xact[uVar8].i) + ABS(psVar9[uVar8].r - xact[uVar8].r);
        if (fVar15 <= fVar18) {
          fVar15 = fVar18;
        }
      }
      if (fVar17 <= fVar14) {
        fVar17 = fVar14;
      }
      if (((1.0 < fVar17) || (fVar18 = 1.0 / fVar13, fVar15 <= (1.0 / fVar14) * fVar17)) &&
         (fVar17 = (fVar15 / fVar17) / ferr[local_140], fVar18 = fVar16, fVar16 <= fVar17)) {
        fVar18 = fVar17;
      }
      fVar16 = fVar18;
      xact = (singlecomplex *)((long)&xact->r + local_150);
      psVar9 = (singlecomplex *)((long)&psVar9->r + local_158);
      uVar8 = local_140 + 1;
    }
    *reslts = fVar16;
    fVar14 = fVar14 * (float)(n + 1);
    psVar9 = local_160;
    for (uVar8 = 0; uVar8 != local_168; uVar8 = uVar8 + 1) {
      for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
        addr[uVar10] = ABS(psVar9[uVar10].i) + ABS(psVar9[uVar10].r);
      }
      lVar11 = uVar8 * local_170;
      if (trans == NOTRANS) {
        uVar10 = 0;
        while (uVar10 != uVar6) {
          fVar16 = x[lVar11 + uVar10].r;
          fVar17 = x[lVar11 + uVar10].i;
          lVar12 = uVar10 * 4;
          iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + uVar10 * 4);
          uVar10 = uVar10 + 1;
          for (lVar12 = (long)*(int *)(*(long *)((long)pvVar4 + 0x18) + lVar12); lVar12 < iVar2;
              lVar12 = lVar12 + 1) {
            uVar1 = *(undefined8 *)(lVar5 + lVar12 * 8);
            iVar3 = *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar12 * 4);
            addr[iVar3] = (ABS((float)((ulong)uVar1 >> 0x20)) + ABS((float)uVar1)) *
                          (ABS(fVar17) + ABS(fVar16)) + addr[iVar3];
          }
        }
      }
      else {
        uVar10 = 0;
        while (uVar10 != uVar6) {
          fVar16 = 0.0;
          for (lVar12 = (long)*(int *)(*(long *)((long)pvVar4 + 0x18) + uVar10 * 4);
              lVar12 < *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + uVar10 * 4);
              lVar12 = lVar12 + 1) {
            uVar1 = *(undefined8 *)(lVar5 + lVar12 * 8);
            fVar16 = fVar16 + (ABS((float)((ulong)uVar1 >> 0x20)) + ABS((float)uVar1)) *
                              (ABS(x[lVar11 + *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar12 * 4)]
                                   .i) +
                              ABS(x[lVar11 + *(int *)(*(long *)((long)pvVar4 + 0x10) + lVar12 * 4)].
                                  r));
          }
          addr[uVar10] = fVar16 + addr[uVar10];
          uVar10 = uVar10 + 1;
        }
      }
      fVar16 = *addr;
      for (uVar10 = 1; uVar10 < uVar6; uVar10 = uVar10 + 1) {
        if (addr[uVar10] <= fVar16) {
          fVar16 = addr[uVar10];
        }
      }
      if (fVar16 <= fVar14) {
        fVar16 = fVar14;
      }
      fVar17 = berr[uVar8] / (fVar14 / fVar16 + fVar13 * (float)(n + 1));
      fVar16 = fVar17;
      if ((uVar8 != 0) && (fVar16 = reslts[1], reslts[1] <= fVar17)) {
        fVar16 = fVar17;
      }
      reslts[1] = fVar16;
      psVar9 = psVar9 + ldb;
    }
    superlu_free(addr);
  }
  return 0;
}

Assistant:

int cgst07(trans_t trans, int n, int nrhs, SuperMatrix *A, singlecomplex *b,
           int ldb, singlecomplex *x, int ldx, singlecomplex *xact,
           int ldxact, float *ferr, float *berr, float *reslts)
{
    /* Table of constant values */
    int c__1 = 1;

    /* System generated locals */
    float d__1, d__2;
    float d__3, d__4;

    /* Local variables */
    float diff, axbi;
    int    imax, irow, n__1;
    int    i, j, k;
    float unfl, ovfl;
    float xnorm;
    float errbnd;
    int    notran;
    float eps, tmp;
    float *rwork;
    singlecomplex *Aval;
    NCformat *Astore;

    /* Function prototypes */
    extern int    icamax_(int *, singlecomplex *, int *);


    /* Quick exit if N = 0 or NRHS = 0. */
    if ( n <= 0 || nrhs <= 0 ) {
	reslts[0] = 0.;
	reslts[1] = 0.;
	return 0;
    }

    eps = smach("Epsilon");
    unfl = smach("Safe minimum");
    ovfl   = 1. / unfl;
    notran = (trans == NOTRANS);

    rwork  = (float *) SUPERLU_MALLOC(n*sizeof(float));
    if ( !rwork ) ABORT("SUPERLU_MALLOC fails for rwork");
    Astore = A->Store;
    Aval   = (singlecomplex *) Astore->nzval;
    
    /* Test 1:  Compute the maximum of   
       norm(X - XACT) / ( norm(X) * FERR )   
       over all the vectors X and XACT using the infinity-norm. */

    errbnd = 0.;
    for (j = 0; j < nrhs; ++j) {
	n__1 = n;
	imax = icamax_(&n__1, &x[j*ldx], &c__1);
	d__1 = (d__2 = x[imax-1 + j*ldx].r, fabs(d__2)) + 
               (d__3 = x[imax-1 + j*ldx].i, fabs(d__3));
	xnorm = SUPERLU_MAX(d__1,unfl);
	diff = 0.;
	for (i = 0; i < n; ++i) {
	    d__1 = (d__2 = x[i+j*ldx].r - xact[i+j*ldxact].r, fabs(d__2)) +
                   (d__3 = x[i+j*ldx].i - xact[i+j*ldxact].i, fabs(d__3));
	    diff = SUPERLU_MAX(diff, d__1);
	}

	if (xnorm > 1.) {
	    goto L20;
	} else if (diff <= ovfl * xnorm) {
	    goto L20;
	} else {
	    errbnd = 1. / eps;
	    goto L30;
	}

L20:
#if 0	
	if (diff / xnorm <= ferr[j]) {
	    d__1 = diff / xnorm / ferr[j];
	    errbnd = SUPERLU_MAX(errbnd,d__1);
	} else {
	    errbnd = 1. / eps;
	}
#endif
	d__1 = diff / xnorm / ferr[j];
	errbnd = SUPERLU_MAX(errbnd,d__1);
	/*printf("Ferr: %f\n", errbnd);*/
L30:
	;
    }
    reslts[0] = errbnd;

    /* Test 2: Compute the maximum of BERR / ( (n+1)*EPS + (*) ), where 
       (*) = (n+1)*UNFL / (min_i (abs(op(A))*abs(X) + abs(b))_i ) */

    for (k = 0; k < nrhs; ++k) {
	for (i = 0; i < n; ++i) 
            rwork[i] = (d__1 = b[i + k*ldb].r, fabs(d__1)) +
                       (d__2 = b[i + k*ldb].i, fabs(d__2));
	if ( notran ) {
	    for (j = 0; j < n; ++j) {
		tmp = (d__1 = x[j + k*ldx].r, fabs(d__1)) +
                      (d__2 = x[j + k*ldx].i, fabs(d__2));
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    d__1 = (d__2 = Aval[i].r, fabs(d__2)) +
                           (d__3 = Aval[i].i, fabs(d__3));
		    rwork[Astore->rowind[i]] += d__1 * tmp;
                }
	    }
	} else {
	    for (j = 0; j < n; ++j) {
		tmp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    d__1 = (d__2 = x[irow + k*ldx].r, fabs(d__2)) +
                           (d__3 = x[irow + k*ldx].i, fabs(d__3));
                    d__2 = (d__3 = Aval[i].r, fabs(d__3)) +
                           (d__4 = Aval[i].i, fabs(d__4));
		    tmp += d__2 * d__1;
		}
		rwork[j] += tmp;
	    }
	}

	axbi = rwork[0];
	for (i = 1; i < n; ++i) axbi = SUPERLU_MIN(axbi, rwork[i]);
	
	/* Computing MAX */
	d__1 = axbi, d__2 = (n + 1) * unfl;
	tmp = berr[k] / ((n + 1) * eps + (n + 1) * unfl / SUPERLU_MAX(d__1,d__2));
	
	if (k == 0) {
	    reslts[1] = tmp;
	} else {
	    reslts[1] = SUPERLU_MAX(reslts[1],tmp);
	}
    }

    SUPERLU_FREE(rwork);
    return 0;

}